

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanical.cpp
# Opt level: O0

bool __thiscall Mechanization::ZUPT(Mechanization *this,Output now)

{
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RDI;
  double extraout_XMM0_Qa;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffffe0;
  
  std::abs((int)in_RDI);
  if (extraout_XMM0_Qa <= 2e-05) {
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
    Eigen::Matrix<double,3,1,0,3,1>::operator=(in_stack_ffffffffffffffe0,in_RDI);
    *(undefined8 *)(in_RDI + 0x90) = *(undefined8 *)(in_RDI + 0x78);
    *(undefined8 *)(in_RDI + 0x98) = *(undefined8 *)(in_RDI + 0x80);
    *(undefined8 *)(in_RDI + 0xa0) = *(undefined8 *)(in_RDI + 0x88);
    *(undefined8 *)(in_RDI + 0x60) = *(undefined8 *)(in_RDI + 0x48);
    *(undefined8 *)(in_RDI + 0x68) = *(undefined8 *)(in_RDI + 0x50);
    *(undefined8 *)(in_RDI + 0x70) = *(undefined8 *)(in_RDI + 0x58);
  }
  return extraout_XMM0_Qa <= 2e-05;
}

Assistant:

bool Mechanization::ZUPT(Output now) {
    if(abs(now.ax) > 2e-5) {
        return false;
    }
    this->nowVel = Vector3d::Zero();
    this->nowPosi = this->prvPosi;
    this->nowPose = this->prvPose;
    return true;
}